

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::CeilDecimalOperator::Operation<int,duckdb::NumericHelper>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  anon_class_8_1_c17bcc2d fun;
  int iVar1;
  reference count;
  Vector *in_RDX;
  byte in_SIL;
  DataChunk *in_RDI;
  int power_of_ten;
  size_type in_stack_ffffffffffffffc8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = UnsafeNumericCast<int,long,void>((&NumericHelper::POWERS_OF_TEN)[in_SIL]);
  count = vector<duckdb::Vector,_true>::operator[]
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  DataChunk::size(in_RDI);
  fun.power_of_ten._4_4_ = iVar1;
  fun.power_of_ten._0_4_ = in_stack_ffffffffffffffe0;
  UnaryExecutor::
  Execute<int,int,duckdb::CeilDecimalOperator::Operation<int,duckdb::NumericHelper>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(int)_1_>
            ((Vector *)&stack0xffffffffffffffe4,in_RDX,(idx_t)count,fun,CANNOT_ERROR);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input <= 0) {
				// below 0 we floor the number (e.g. -10.5 -> -10)
				return UnsafeNumericCast<T>(input / power_of_ten);
			} else {
				// above 0 we ceil the number
				return UnsafeNumericCast<T>(((input - 1) / power_of_ten) + 1);
			}
		});
	}